

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O1

size_t __thiscall rcg::Buffer::getSize(Buffer *this,uint32_t part)

{
  size_t sVar1;
  GC_ERROR GVar2;
  void *pvVar3;
  unsigned_long ret;
  size_t size;
  INFO_DATATYPE type;
  size_t local_30 [2];
  INFO_DATATYPE local_1c;
  
  if (this->multipart == true) {
    pvVar3 = Stream::getHandle(this->parent);
    local_30[0] = 0;
    local_30[1] = 8;
    if (this->buffer != (BUFFER_HANDLE)0x0 && pvVar3 != (void *)0x0) {
      (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->DSGetBufferPartInfo)(pvVar3,this->buffer,part,1,&local_1c,local_30,local_30 + 1);
    }
  }
  else {
    pvVar3 = Stream::getHandle(this->parent);
    local_30[0] = 0;
    local_30[1] = 8;
    if ((this->buffer != (BUFFER_HANDLE)0x0 && pvVar3 != (void *)0x0) &&
       (GVar2 = (*((this->gentl).
                   super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  DSGetBufferInfo)(pvVar3,this->buffer,1,&local_1c,local_30,local_30 + 1),
       GVar2 != 0)) {
      local_30[0] = 0;
    }
    sVar1 = local_30[0];
    pvVar3 = Stream::getHandle(this->parent);
    local_30[0] = 0;
    local_30[1] = 8;
    if ((this->buffer != (BUFFER_HANDLE)0x0 && pvVar3 != (void *)0x0) &&
       (GVar2 = (*((this->gentl).
                   super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  DSGetBufferInfo)(pvVar3,this->buffer,0x12,&local_1c,local_30,local_30 + 1),
       GVar2 != 0)) {
      local_30[0] = 0;
    }
    local_30[0] = sVar1 - local_30[0];
  }
  return local_30[0];
}

Assistant:

size_t Buffer::getSize(uint32_t part) const
{
  if (multipart)
  {
    return getBufferPartValue<size_t>(gentl, parent->getHandle(), buffer, part,
                                      GenTL::BUFFER_PART_INFO_DATA_SIZE);
  }
  else
  {
    size_t size=getBufferValue<size_t>(gentl, parent->getHandle(), buffer,
                                       GenTL::BUFFER_INFO_SIZE);

    size_t offset=getBufferValue<size_t>(gentl, parent->getHandle(), buffer,
                                         GenTL::BUFFER_INFO_IMAGEOFFSET);

    return size-offset;
  }
}